

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O3

int __thiscall particleSamples::read_in_particle_samples_UrQMD_zipped(particleSamples *this)

{
  pretty_ostream *this_00;
  vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
  *this_01;
  iterator __position;
  vector<particle_info,std::allocator<particle_info>> *this_02;
  undefined4 uVar1;
  int iVar2;
  istream *piVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  anon_struct_120_15_f999644b *paVar7;
  particleSamples *ppVar8;
  iterator __position_00;
  byte bVar9;
  int n_particle;
  int urqmd_iso3;
  int urqmd_pid;
  string temp_string;
  double dummy;
  int urqmd_charge;
  int parent_proc_type;
  particle_info temp_particle_info;
  stringstream temp1;
  stringstream temp2;
  undefined1 local_488 [32];
  ostringstream *local_468;
  pointer local_460;
  ostringstream local_458 [24];
  int local_440;
  int local_43c;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  anon_struct_120_15_f999644b local_3b8;
  undefined1 local_340 [128];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> abStack_2c0 [8];
  undefined1 local_1b8 [128];
  ios_base aiStack_138 [264];
  
  bVar9 = 0;
  ppVar8 = (particleSamples *)this->full_particle_list;
  clear_out_previous_record
            (this,(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   *)ppVar8);
  local_468 = local_458;
  local_460 = (pointer)0x0;
  local_458[0] = (ostringstream)0x0;
  if (0 < this->event_buffer_size) {
    local_488._24_8_ = aiStack_138;
    local_488._16_8_ = abStack_2c0;
    this_00 = &this->messager;
    lVar6 = 0;
    local_488._4_4_ = 0;
    do {
      gz_readline_abi_cxx11_((string *)local_340,ppVar8,this->inputfile_gz);
      std::__cxx11::string::operator=((string *)&local_468,(string *)local_340);
      if ((vector<particle_info,_std::allocator<particle_info>_> *)local_340._0_8_ !=
          (vector<particle_info,_std::allocator<particle_info>_> *)(local_340 + 0x10)) {
        operator_delete((void *)local_340._0_8_);
      }
      iVar2 = gzeof(this->inputfile_gz);
      if (iVar2 != 0) break;
      this_01 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                 *)this->full_particle_list;
      local_340._0_8_ = operator_new(0x18);
      (((vector<particle_info,_std::allocator<particle_info>_> *)local_340._0_8_)->
      super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (((vector<particle_info,_std::allocator<particle_info>_> *)local_340._0_8_)->
      super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (((vector<particle_info,_std::allocator<particle_info>_> *)local_340._0_8_)->
      super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __position._M_current =
           *(vector<particle_info,_std::allocator<particle_info>_> ***)(this_01 + 8);
      if (__position._M_current ==
          *(vector<particle_info,_std::allocator<particle_info>_> ***)(this_01 + 0x10)) {
        std::
        vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
        ::_M_realloc_insert<std::vector<particle_info,std::allocator<particle_info>>*>
                  (this_01,__position,
                   (vector<particle_info,_std::allocator<particle_info>_> **)local_340);
      }
      else {
        *__position._M_current =
             (vector<particle_info,_std::allocator<particle_info>_> *)local_340._0_8_;
        *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
      }
      std::__cxx11::stringstream::stringstream
                ((stringstream *)local_340,(string *)&local_468,_S_out|_S_in);
      ppVar8 = (particleSamples *)local_488;
      std::istream::operator>>((istream *)local_340,(int *)local_488);
      gz_readline_abi_cxx11_((string *)local_1b8,ppVar8,this->inputfile_gz);
      ppVar8 = (particleSamples *)local_1b8;
      std::__cxx11::string::operator=((string *)&local_468,(string *)local_1b8);
      if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_);
      }
      if (0 < (int)local_488._0_4_) {
        iVar2 = 0;
        do {
          gz_readline_abi_cxx11_((string *)local_1b8,ppVar8,this->inputfile_gz);
          std::__cxx11::string::operator=((string *)&local_468,(string *)local_1b8);
          if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
            operator_delete((void *)local_1b8._0_8_);
          }
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)local_1b8,(string *)&local_468,_S_out|_S_in);
          piVar3 = (istream *)
                   std::istream::operator>>((istream *)local_1b8,(int *)(local_488 + 0xc));
          piVar3 = (istream *)std::istream::operator>>(piVar3,(int *)(local_488 + 8));
          pdVar4 = (double *)std::istream::operator>>(piVar3,&local_440);
          piVar3 = std::istream::_M_extract<double>(pdVar4);
          piVar3 = std::istream::_M_extract<double>((double *)piVar3);
          std::istream::operator>>(piVar3,&local_43c);
          piVar3 = std::istream::_M_extract<double>((double *)local_1b8);
          piVar3 = std::istream::_M_extract<double>((double *)piVar3);
          piVar3 = std::istream::_M_extract<double>((double *)piVar3);
          piVar3 = std::istream::_M_extract<double>((double *)piVar3);
          piVar3 = std::istream::_M_extract<double>((double *)piVar3);
          piVar3 = std::istream::_M_extract<double>((double *)piVar3);
          piVar3 = std::istream::_M_extract<double>((double *)piVar3);
          piVar3 = std::istream::_M_extract<double>((double *)piVar3);
          std::istream::_M_extract<double>((double *)piVar3);
          local_3b8.monval = get_pdg_id(this,local_488._12_4_,local_488._8_4_);
          if (local_3b8.monval == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"nev = ",6);
            std::ostream::operator<<(this_00,(int)lVar6);
            local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"error","");
            pretty_ostream::flush(this_00,&local_3d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
              operator_delete(local_3d8._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"nparticles = ",0xd);
            std::ostream::operator<<(this_00,local_488._0_4_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ipart = ",10);
            std::ostream::operator<<(this_00,iVar2);
            local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"error","");
            pretty_ostream::flush(this_00,&local_3f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
              operator_delete(local_3f8._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"mass = ",7);
            std::ostream::_M_insert<double>(local_3b8.mass);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", E = ",6);
            std::ostream::_M_insert<double>(local_3b8.E);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", px = ",7);
            std::ostream::_M_insert<double>(local_3b8.px);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", py = ",7);
            std::ostream::_M_insert<double>(local_3b8.py);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", pz = ",7);
            std::ostream::_M_insert<double>(local_3b8.pz);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", t = ",6);
            std::ostream::_M_insert<double>(local_3b8.t);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", x = ",6);
            std::ostream::_M_insert<double>(local_3b8.x);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", y = ",6);
            std::ostream::_M_insert<double>(local_3b8.y);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", z = ",6);
            std::ostream::_M_insert<double>(local_3b8.z);
            local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"error","");
            pretty_ostream::flush(this_00,&local_418);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p != &local_418.field_2) {
              operator_delete(local_418._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"Ignore this particle!",0x15);
            local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"error","");
            pretty_ostream::flush(this_00,&local_438);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438._M_dataplus._M_p != &local_438.field_2) {
              operator_delete(local_438._M_dataplus._M_p);
            }
          }
          else {
            this_02 = (vector<particle_info,std::allocator<particle_info>> *)
                      (this->full_particle_list->
                      super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                      )._M_impl.super__Vector_impl_data._M_start[lVar6];
            __position_00._M_current = *(anon_struct_120_15_f999644b **)(this_02 + 8);
            if (__position_00._M_current == *(anon_struct_120_15_f999644b **)(this_02 + 0x10)) {
              std::vector<particle_info,std::allocator<particle_info>>::
              _M_realloc_insert<particle_info_const&>(this_02,__position_00,&local_3b8);
            }
            else {
              paVar7 = &local_3b8;
              for (lVar5 = 0xf; lVar5 != 0; lVar5 = lVar5 + -1) {
                uVar1 = *(undefined4 *)&paVar7->field_0x4;
                (__position_00._M_current)->monval = paVar7->monval;
                *(undefined4 *)&(__position_00._M_current)->field_0x4 = uVar1;
                paVar7 = (anon_struct_120_15_f999644b *)((long)paVar7 + ((ulong)bVar9 * -2 + 1) * 8)
                ;
                __position_00._M_current = __position_00._M_current + (ulong)bVar9 * -0x10 + 8;
              }
              *(long *)(this_02 + 8) = *(long *)(this_02 + 8) + 0x78;
            }
          }
          ppVar8 = (particleSamples *)&std::__cxx11::stringstream::VTT;
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base((ios_base *)local_488._24_8_);
          iVar2 = iVar2 + 1;
        } while (iVar2 < (int)local_488._0_4_);
      }
      iVar2 = local_488._4_4_ + local_488._0_4_;
      lVar6 = lVar6 + 1;
      ppVar8 = (particleSamples *)&std::__cxx11::stringstream::VTT;
      std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
      std::ios_base::~ios_base((ios_base *)local_488._16_8_);
      local_488._4_4_ = iVar2;
    } while (iVar2 < this->event_buffer_size);
    if (local_468 != local_458) {
      operator_delete(local_468);
    }
  }
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_UrQMD_zipped() {
    // clean out the previous record
    clear_out_previous_record(full_particle_list);

    std::string temp_string;
    int n_particle;
    double dummy;
    int parent_proc_type;
    int ievent = 0;
    int urqmd_pid, urqmd_iso3, urqmd_charge;
    int num_particles = 0;
    while (num_particles < event_buffer_size) {
        temp_string = gz_readline(inputfile_gz);

        if (gzeof(inputfile_gz)) break;

        full_particle_list->push_back(new vector<particle_info>);

        // get number of particles within the event
        std::stringstream temp1(temp_string);
        temp1 >> n_particle;

        // then get one useless line
        temp_string = gz_readline(inputfile_gz);

        for (int ipart = 0; ipart < n_particle; ipart++) {
            temp_string = gz_readline(inputfile_gz);
            std::stringstream temp2(temp_string);
            temp2 >> urqmd_pid >> urqmd_iso3 >> urqmd_charge >> dummy >> dummy
                >> parent_proc_type;

            particle_info temp_particle_info;
            temp2 >> temp_particle_info.mass >> temp_particle_info.t
                >> temp_particle_info.x >> temp_particle_info.y
                >> temp_particle_info.z >> temp_particle_info.E
                >> temp_particle_info.px >> temp_particle_info.py
                >> temp_particle_info.pz;
            temp_particle_info.monval = get_pdg_id(urqmd_pid, urqmd_iso3);
            if (temp_particle_info.monval == 0) {
                messager << "nev = " << ievent;
                messager.flush("error");
                messager << "nparticles = " << n_particle
                         << ", ipart = " << ipart;
                messager.flush("error");
                messager << "mass = " << temp_particle_info.mass
                         << ", E = " << temp_particle_info.E
                         << ", px = " << temp_particle_info.px
                         << ", py = " << temp_particle_info.py
                         << ", pz = " << temp_particle_info.pz
                         << ", t = " << temp_particle_info.t
                         << ", x = " << temp_particle_info.x
                         << ", y = " << temp_particle_info.y
                         << ", z = " << temp_particle_info.z;
                messager.flush("error");
                messager << "Ignore this particle!";
                messager.flush("error");
            } else {
                (*full_particle_list)[ievent]->push_back(temp_particle_info);
            }
        }
        num_particles += n_particle;
        ievent++;
    }
    return (0);
}